

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void __thiscall
clunk::Node::GetSliderDiscovers(Node *this,Color color,MoveType type,uint64_t mvs,int from)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  byte *pbVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  uint to;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6f9,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fa,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  uVar11 = (ulong)(uint)from;
  pbVar7 = (byte *)(&_board)[uVar11];
  if (pbVar7 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fb,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((color | type) != (uint)*pbVar7) {
    __assert_fail("_board[from]->type == (color|type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fc,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((uint)pbVar7[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fd,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  iVar9 = GetPinDir(this,color,from);
  if (mvs != 0) {
    do {
      if ((mvs & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x700,
                      "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                     );
      }
      uVar17 = (int)(mvs & 0xff) - 1;
      if ((uVar17 & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x107,"int clunk::Direction(const int, const int)");
      }
      bVar1 = (&_dir)[(ulong)uVar17 + uVar11 * 0x80];
      if (((0x11 < bVar1) || ((0x38002U >> (bVar1 & 0x1f) & 1) == 0)) &&
         ((0x10 < bVar1 - 0xef || ((0x10007U >> (bVar1 - 0xef & 0x1f) & 1) == 0)))) {
        __assert_fail("IS_DIR(dir)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x703,
                      "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                     );
      }
      iVar13 = (int)(char)bVar1;
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      if ((iVar9 == 0) || (iVar14 == iVar9)) {
        to = from + iVar13;
        if ((to & 0xffffff88) != 0) {
LAB_00130e73:
          __assert_fail("IS_SQUARE(to)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x706,
                        "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                       );
        }
        uVar16 = from + iVar13 * 2;
        while( true ) {
          uVar15 = (ulong)to;
          if ((&_dir)[uVar15 + uVar11 * 0x80] != bVar1) {
            __assert_fail("Direction(from, to) == dir",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x707,
                          "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                         );
          }
          cVar2 = *(char *)(&_board)[uVar15];
          if ((cVar2 == '\0') && ((char *)(&_board)[uVar15] != _EMPTY)) {
            __assert_fail("cap || (_board[to] == _EMPTY)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x709,
                          "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                         );
          }
          if (cVar2 != '\0') break;
          uVar10 = (uint)!color * 8 + to;
          if (type == BishopMove) {
            bVar3 = _kingDir[uVar10];
            if (bVar3 < 0xef) {
              if ((bVar3 != 0xf) && (bVar3 != 0x11)) {
LAB_00130d94:
                iVar14 = this->moveCount;
                lVar12 = (long)iVar14;
                if (lVar12 < 0) {
                  __assert_fail("moveCount >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                ,0x60d,
                                "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                               );
                }
                if (0x7e < iVar14) {
                  __assert_fail("(moveCount + 1) < MaxMoves",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                ,0x60e,
                                "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                               );
                }
                iVar4 = *(int *)(_SQR + uVar15 * 4);
                iVar5 = *(int *)(_SQR + uVar11 * 4);
                this->moveCount = iVar14 + 1;
                Move::Set(this->moves + lVar12,type,from,to,0,0,(iVar4 - iVar5) + 10);
                uVar6 = this->moves[lVar12].bits;
                iVar14 = 0x32;
                if (uVar6 != this->killer[1].bits) {
                  iVar14 = 0;
                }
                if (uVar6 == this->killer[0].bits) {
                  iVar14 = 0x32;
                }
                Move::IncScore(this->moves + lVar12,iVar14);
              }
            }
            else if ((bVar3 != 0xef) && (bVar3 != 0xf1)) goto LAB_00130d94;
          }
          else {
            bVar3 = _kingDir[uVar10];
            if (bVar3 < 0xf0) {
              if ((bVar3 != 1) && (bVar3 != 0x10)) goto LAB_00130d94;
            }
            else if ((bVar3 != 0xf0) && (bVar3 != 0xff)) goto LAB_00130d94;
          }
          if (uVar17 == to) break;
          to = to + iVar13;
          uVar10 = uVar16 & 0xffffff88;
          uVar16 = uVar16 + iVar13;
          if (uVar10 != 0) goto LAB_00130e73;
        }
      }
      bVar8 = 0xff < mvs;
      mvs = mvs >> 8;
    } while (bVar8);
  }
  return;
}

Assistant:

void GetSliderDiscovers(const Color color, const MoveType type,
                          uint64_t mvs, const int from)
  {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|type));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    while (mvs) {
      assert(mvs & 0xFF);
      const int end = ((mvs & 0xFF) - 1);
      const int dir = (Direction(from, end));
      assert(IS_DIR(dir));
      if (!pinDir || (abs(dir) == pinDir)) {
        for (int to = (from + dir);; to += dir) {
          assert(IS_SQUARE(to));
          assert(Direction(from, to) == dir);
          const int cap = _board[to]->type;
          assert(cap || (_board[to] == _EMPTY));
          if (!cap) {
            if ((type == BishopMove) ? !IS_DIAG(_kingDir[to + (8 * !color)])
                                     : !IS_CROSS(_kingDir[to + (8 * !color)]))
            {
              const int score = (_SQR[to] - _SQR[from] + 10);
              AddMove(type, from, to, score);
            }
          }
          else {
            break;
          }
          if (to == end) {
            break;
          }
        }
      }
      mvs >>= 8;
    }
  }